

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializeToArray(MessageLite *this,void *data,int size)

{
  bool bVar1;
  LogMessage *pLVar2;
  MessageLite *in_R8;
  string_view action;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  string local_68;
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  int local_1c;
  void *pvStack_18;
  int size_local;
  void *data_local;
  MessageLite *this_local;
  
  local_1c = size;
  pvStack_18 = data;
  data_local = this;
  bVar1 = IsInitialized(this);
  local_31 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x268,"IsInitialized()");
    local_31 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"serialize");
    action._M_str = (char *)this;
    action._M_len = (size_t)local_78._M_str;
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)local_78._M_len,action,in_R8);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if ((local_31 & 1) == 0) {
    bVar1 = SerializePartialToArray(this,pvStack_18,local_1c);
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

bool MessageLite::SerializeToArray(void* data, int size) const {
  ABSL_DCHECK(IsInitialized())
      << InitializationErrorMessage("serialize", *this);
  return SerializePartialToArray(data, size);
}